

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_gsnlist(CHAR_DATA *ch,char *argument)

{
  BUFFER *buffer;
  char *txt;
  int iVar1;
  ulong uVar2;
  skill_type *psVar3;
  char buf [4608];
  
  psVar3 = skill_table;
  buffer = new_buf();
  iVar1 = 0;
  for (uVar2 = 0; uVar2 != 800; uVar2 = uVar2 + 1) {
    if (psVar3->name != (char *)0x0) {
      sprintf(buf,"%-18s %3d  ",psVar3->name,uVar2 & 0xffffffff);
      add_buf(buffer,buf);
      iVar1 = iVar1 + 1;
      if (iVar1 % 3 == 0) {
        add_buf(buffer,"\n\r");
      }
    }
    psVar3 = psVar3 + 1;
  }
  txt = buf_string(buffer);
  page_to_char(txt,ch);
  free_buf(buffer);
  return;
}

Assistant:

void do_gsnlist(CHAR_DATA *ch, char *argument)
{
	int sn, col = 0;
	char buf[MSL];
	BUFFER *output;

	output = new_buf();

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			continue;

		sprintf(buf, "%-18s %3d  ", skill_table[sn].name, sn);
		add_buf(output, buf);

		if (++col % 3 == 0)
			add_buf(output, "\n\r");
	}

	page_to_char(buf_string(output), ch);
	free_buf(output);
}